

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O1

void __thiscall spv::Block::rewriteAsCanonicalUnreachableContinue(Block *this,Block *header)

{
  pointer *pppBVar1;
  pointer ppBVar2;
  iterator __position;
  Block *pBVar3;
  Instruction *this_00;
  Instruction *raw_instruction;
  Block *local_38;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  local_38 = header;
  if ((this->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("localVariables.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0x126,"void spv::Block::rewriteAsCanonicalUnreachableContinue(Block *)");
  }
  if ((this->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::resize(&this->instructions,1);
    pBVar3 = local_38;
    ppBVar2 = (this->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppBVar2) {
      (this->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppBVar2;
    }
    if (local_38 != (Block *)0x0) {
      this_00 = (Instruction *)operator_new(0x60);
      this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
      this_00->resultId = 0;
      this_00->typeId = 0;
      this_00->opCode = OpBranch;
      (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      this_00->block = (Block *)0x0;
      Instruction::addIdOperand
                (this_00,*(Id *)((long)(((pBVar3->instructions).
                                         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                       ._M_t + 8));
      local_30._M_head_impl = this_00;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&this->instructions,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
      this_00->block = this;
      if (this_00->resultId != 0) {
        Module::mapInstruction(this->parent->parent,this_00);
      }
      if (local_30._M_head_impl != (Instruction *)0x0) {
        (*(local_30._M_head_impl)->_vptr_Instruction[1])();
      }
      local_30._M_head_impl = (Instruction *)0x0;
      __position._M_current =
           (this->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<spv::Block*,std::allocator<spv::Block*>>::_M_realloc_insert<spv::Block*const&>
                  ((vector<spv::Block*,std::allocator<spv::Block*>> *)&this->successors,__position,
                   &local_38);
      }
      else {
        *__position._M_current = local_38;
        pppBVar1 = &(this->successors).
                    super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
      return;
    }
    __assert_fail("header != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,300,"void spv::Block::rewriteAsCanonicalUnreachableContinue(Block *)");
  }
  __assert_fail("instructions.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0x128,"void spv::Block::rewriteAsCanonicalUnreachableContinue(Block *)");
}

Assistant:

void rewriteAsCanonicalUnreachableContinue(Block* header) {
        assert(localVariables.empty());
        // Delete all instructions except for the label.
        assert(instructions.size() > 0);
        instructions.resize(1);
        successors.clear();
        // Add OpBranch back to the header.
        assert(header != nullptr);
        Instruction* branch = new Instruction(OpBranch);
        branch->addIdOperand(header->getId());
        addInstruction(std::unique_ptr<Instruction>(branch));
        successors.push_back(header);
    }